

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildTestStatusFormatReplacePlaceholder::Run(BuildTestStatusFormatReplacePlaceholder *this)

{
  Test *this_00;
  bool condition;
  string local_30;
  
  this_00 = g_current_test;
  BuildStatus::FormatProgressStatus_abi_cxx11_
            (&local_30,&(this->super_BuildTest).status_,"[%%/s%s/t%t/r%r/u%u/f%f]",kEdgeStarted);
  condition = std::operator==("[%/s0/t0/r0/u0/f0]",&local_30);
  testing::Test::Check
            (this_00,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
             ,0x73e,
             "\"[%/s0/t0/r0/u0/f0]\" == status_.FormatProgressStatus(\"[%%/s%s/t%t/r%r/u%u/f%f]\", BuildStatus::kEdgeStarted)"
            );
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

TEST_F(BuildTest, StatusFormatReplacePlaceholder) {
  EXPECT_EQ("[%/s0/t0/r0/u0/f0]",
            status_.FormatProgressStatus("[%%/s%s/t%t/r%r/u%u/f%f]",
                BuildStatus::kEdgeStarted));
}